

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::ShaderMultisampleInterpolationTests::init
          (ShaderMultisampleInterpolationTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  TestType TVar2;
  Context *pCVar3;
  int extraout_EAX;
  TestNode *pTVar4;
  MultisampleRenderCase *pMVar5;
  TestNode *pTVar6;
  undefined8 *puVar7;
  long lVar8;
  long lVar9;
  long *local_50 [2];
  long local_40 [2];
  
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "sample_qualifier","Test sample qualifier");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar8 = 0x14;
  do {
    pMVar5 = (MultisampleRenderCase *)operator_new(0x128);
    MultisampleShaderRenderUtil::MultisampleRenderCase::MultisampleRenderCase
              (pMVar5,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&PTR_deinit_021569c8 + lVar8 + 4),
               *(char **)((long)&PTR_iterate_021569d0 + lVar8 + 4),*(int *)(&UNK_021569dc + lVar8),
               *(RenderTarget *)((long)&init::targets[0].name + lVar8),0x80,1);
    (pMVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleRenderCase_02156c88;
    pMVar5->m_numIterations = 6;
    tcu::TestNode::addChild(pTVar4,(TestNode *)pMVar5);
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x14c);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "interpolate_at_sample","Test interpolateAtSample");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "static_sample_number","Test interpolateAtSample sample number");
  tcu::TestNode::addChild(pTVar4,pTVar6);
  lVar8 = 0x14;
  do {
    pMVar5 = (MultisampleRenderCase *)operator_new(0x130);
    MultisampleShaderRenderUtil::MultisampleRenderCase::MultisampleRenderCase
              (pMVar5,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&PTR_deinit_021569c8 + lVar8 + 4),
               *(char **)((long)&PTR_iterate_021569d0 + lVar8 + 4),*(int *)(&UNK_021569dc + lVar8),
               *(RenderTarget *)((long)&init::targets[0].name + lVar8),0x80,1);
    (pMVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleRenderCase_02156d40;
    *(undefined4 *)&pMVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
    pMVar5->m_numIterations = 5;
    tcu::TestNode::addChild(pTVar6,(TestNode *)pMVar5);
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x14c);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "dynamic_sample_number","Test interpolateAtSample sample number");
  tcu::TestNode::addChild(pTVar4,pTVar6);
  lVar8 = 0x14;
  do {
    pMVar5 = (MultisampleRenderCase *)operator_new(0x130);
    MultisampleShaderRenderUtil::MultisampleRenderCase::MultisampleRenderCase
              (pMVar5,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&PTR_deinit_021569c8 + lVar8 + 4),
               *(char **)((long)&PTR_iterate_021569d0 + lVar8 + 4),*(int *)(&UNK_021569dc + lVar8),
               *(RenderTarget *)((long)&init::targets[0].name + lVar8),0x80,1);
    (pMVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleRenderCase_02156d40;
    *(undefined4 *)&pMVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 1;
    pMVar5->m_numIterations = 5;
    tcu::TestNode::addChild(pTVar6,(TestNode *)pMVar5);
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x14c);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "non_multisample_buffer","Test interpolateAtSample with non-multisample buffers");
  tcu::TestNode::addChild(pTVar4,pTVar6);
  lVar8 = 0x14;
  do {
    if (*(int *)(&UNK_021569dc + lVar8) == 0) {
      pMVar5 = (MultisampleRenderCase *)operator_new(0x130);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"sample_0_","");
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      MultisampleShaderRenderUtil::MultisampleRenderCase::MultisampleRenderCase
                (pMVar5,pCVar3,(char *)*puVar7,*(char **)((long)&PTR_iterate_021569d0 + lVar8 + 4),0
                 ,*(RenderTarget *)((long)&init::targets[0].name + lVar8),0x20,0);
      (pMVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__MultisampleRenderCase_02156de0;
      *(undefined4 *)&pMVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
      tcu::TestNode::addChild(pTVar6,(TestNode *)pMVar5);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x14c);
  lVar8 = 0x14;
  do {
    if (*(int *)(&UNK_021569dc + lVar8) == 0) {
      pMVar5 = (MultisampleRenderCase *)operator_new(0x130);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"sample_n_","");
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      MultisampleShaderRenderUtil::MultisampleRenderCase::MultisampleRenderCase
                (pMVar5,pCVar3,(char *)*puVar7,*(char **)((long)&PTR_iterate_021569d0 + lVar8 + 4),0
                 ,*(RenderTarget *)((long)&init::targets[0].name + lVar8),0x20,0);
      (pMVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__MultisampleRenderCase_02156de0;
      *(undefined4 *)&pMVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 1;
      tcu::TestNode::addChild(pTVar6,(TestNode *)pMVar5);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x14c);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "centroid_qualified","Test interpolateAtSample with centroid qualified varying");
  tcu::TestNode::addChild(pTVar4,pTVar6);
  lVar8 = 0x14;
  do {
    pMVar5 = (MultisampleRenderCase *)operator_new(0x128);
    MultisampleShaderRenderUtil::MultisampleRenderCase::MultisampleRenderCase
              (pMVar5,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&PTR_deinit_021569c8 + lVar8 + 4),
               *(char **)((long)&PTR_iterate_021569d0 + lVar8 + 4),*(int *)(&UNK_021569dc + lVar8),
               *(RenderTarget *)((long)&init::targets[0].name + lVar8),0x80,0);
    (pMVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleRenderCase_02156e80;
    tcu::TestNode::addChild(pTVar6,(TestNode *)pMVar5);
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x14c);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"at_sample_id"
             ,"Test interpolateAtSample at current sample id");
  tcu::TestNode::addChild(pTVar4,pTVar6);
  lVar8 = 0x14;
  do {
    pMVar5 = (MultisampleRenderCase *)operator_new(0x128);
    MultisampleShaderRenderUtil::MultisampleRenderCase::MultisampleRenderCase
              (pMVar5,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&PTR_deinit_021569c8 + lVar8 + 4),
               *(char **)((long)&PTR_iterate_021569d0 + lVar8 + 4),*(int *)(&UNK_021569dc + lVar8),
               *(RenderTarget *)((long)&init::targets[0].name + lVar8),0x20,0);
    (pMVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleRenderCase_02156f38;
    tcu::TestNode::addChild(pTVar6,(TestNode *)pMVar5);
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x14c);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"negative",
             "interpolateAtSample negative tests");
  tcu::TestNode::addChild(pTVar4,pTVar6);
  lVar8 = 0x10;
  do {
    pTVar4 = (TestNode *)operator_new(0x80);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    uVar1 = *(undefined4 *)((long)&init::negativeCompileCases[0].name + lVar8);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,pCVar3->m_testCtx,
               *(char **)((long)&init::targets[0xc].numSamples + lVar8),
               *(char **)(&UNK_02156b18 + lVar8));
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar3;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02156fd8;
    *(undefined4 *)&pTVar4[1].m_testCtx = uVar1;
    *(undefined4 *)((long)&pTVar4[1].m_testCtx + 4) = 0;
    tcu::TestNode::addChild(pTVar6,pTVar4);
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x118);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "interpolate_at_centroid","Test interpolateAtCentroid");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"consistency",
             "Test interpolateAtCentroid return value is consistent to centroid qualified value");
  tcu::TestNode::addChild(pTVar4,pTVar6);
  lVar8 = 0x14;
  do {
    pMVar5 = (MultisampleRenderCase *)operator_new(0x130);
    MultisampleShaderRenderUtil::MultisampleRenderCase::MultisampleRenderCase
              (pMVar5,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&PTR_deinit_021569c8 + lVar8 + 4),
               *(char **)((long)&PTR_iterate_021569d0 + lVar8 + 4),*(int *)(&UNK_021569dc + lVar8),
               *(RenderTarget *)((long)&init::targets[0].name + lVar8),0x80,0);
    (pMVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleRenderCase_02157028;
    *(undefined4 *)&pMVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
    tcu::TestNode::addChild(pTVar6,(TestNode *)pMVar5);
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x14c);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "array_element","Test interpolateAtCentroid with array element");
  tcu::TestNode::addChild(pTVar4,pTVar6);
  lVar8 = 0x14;
  do {
    pMVar5 = (MultisampleRenderCase *)operator_new(0x130);
    MultisampleShaderRenderUtil::MultisampleRenderCase::MultisampleRenderCase
              (pMVar5,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&PTR_deinit_021569c8 + lVar8 + 4),
               *(char **)((long)&PTR_iterate_021569d0 + lVar8 + 4),*(int *)(&UNK_021569dc + lVar8),
               *(RenderTarget *)((long)&init::targets[0].name + lVar8),0x80,0);
    (pMVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleRenderCase_02157028;
    *(undefined4 *)&pMVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 1;
    tcu::TestNode::addChild(pTVar6,(TestNode *)pMVar5);
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x14c);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"negative",
             "interpolateAtCentroid negative tests");
  tcu::TestNode::addChild(pTVar4,pTVar6);
  lVar8 = 0x10;
  do {
    pTVar4 = (TestNode *)operator_new(0x80);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    uVar1 = *(undefined4 *)((long)&init::negativeCompileCases[0].name + lVar8);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,pCVar3->m_testCtx,
               *(char **)((long)&init::targets[0xc].numSamples + lVar8),
               *(char **)(&UNK_02156b18 + lVar8));
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar3;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02156fd8;
    *(undefined4 *)&pTVar4[1].m_testCtx = uVar1;
    *(undefined4 *)((long)&pTVar4[1].m_testCtx + 4) = 1;
    tcu::TestNode::addChild(pTVar6,pTVar4);
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x118);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "interpolate_at_offset","Test interpolateAtOffset");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar8 = 0;
  do {
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::configs[lVar8].name,
               "Test interpolateAtOffset with qualified/non-qualified varying");
    tcu::TestNode::addChild(pTVar4,pTVar6);
    lVar9 = 0x14;
    do {
      pMVar5 = (MultisampleRenderCase *)operator_new(0x130);
      TVar2 = init::configs[lVar8].type;
      MultisampleShaderRenderUtil::MultisampleRenderCase::MultisampleRenderCase
                (pMVar5,(this->super_TestCaseGroup).m_context,
                 *(char **)((long)&PTR_deinit_021569c8 + lVar9 + 4),
                 *(char **)((long)&PTR_iterate_021569d0 + lVar9 + 4),*(int *)(&UNK_021569dc + lVar9)
                 ,*(RenderTarget *)((long)&init::targets[0].name + lVar9),0x20,0);
      (pMVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__MultisampleRenderCase_021570c8;
      *(TestType *)&pMVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = TVar2;
      tcu::TestNode::addChild(pTVar6,(TestNode *)pMVar5);
      lVar9 = lVar9 + 0x18;
    } while (lVar9 != 0x14c);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "at_sample_position","Test interpolateAtOffset at sample position");
  tcu::TestNode::addChild(pTVar4,pTVar6);
  lVar8 = 0x14;
  do {
    pMVar5 = (MultisampleRenderCase *)operator_new(0x128);
    MultisampleShaderRenderUtil::MultisampleRenderCase::MultisampleRenderCase
              (pMVar5,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&PTR_deinit_021569c8 + lVar8 + 4),
               *(char **)((long)&PTR_iterate_021569d0 + lVar8 + 4),*(int *)(&UNK_021569dc + lVar8),
               *(RenderTarget *)((long)&init::targets[0].name + lVar8),0x20,0);
    (pMVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleRenderCase_02157168;
    tcu::TestNode::addChild(pTVar6,(TestNode *)pMVar5);
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x14c);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "array_element","Test interpolateAtOffset with array element");
  tcu::TestNode::addChild(pTVar4,pTVar6);
  lVar8 = 0x14;
  do {
    pMVar5 = (MultisampleRenderCase *)operator_new(0x130);
    MultisampleShaderRenderUtil::MultisampleRenderCase::MultisampleRenderCase
              (pMVar5,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&PTR_deinit_021569c8 + lVar8 + 4),
               *(char **)((long)&PTR_iterate_021569d0 + lVar8 + 4),*(int *)(&UNK_021569dc + lVar8),
               *(RenderTarget *)((long)&init::targets[0].name + lVar8),0x20,0);
    (pMVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__MultisampleRenderCase_021570c8;
    *(undefined4 *)&pMVar5[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 3;
    tcu::TestNode::addChild(pTVar6,(TestNode *)pMVar5);
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x14c);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"negative",
             "interpolateAtOffset negative tests");
  tcu::TestNode::addChild(pTVar4,pTVar6);
  lVar8 = 0x10;
  do {
    pTVar4 = (TestNode *)operator_new(0x80);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    uVar1 = *(undefined4 *)((long)&init::negativeCompileCases[0].name + lVar8);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,pCVar3->m_testCtx,
               *(char **)((long)&init::targets[0xc].numSamples + lVar8),
               *(char **)(&UNK_02156b18 + lVar8));
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar3;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02156fd8;
    *(undefined4 *)&pTVar4[1].m_testCtx = uVar1;
    *(undefined4 *)((long)&pTVar4[1].m_testCtx + 4) = 2;
    tcu::TestNode::addChild(pTVar6,pTVar4);
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x118);
  return extraout_EAX;
}

Assistant:

void ShaderMultisampleInterpolationTests::init (void)
{
	using namespace MultisampleShaderRenderUtil;

	static const struct RenderTarget
	{
		const char*							name;
		const char*							desc;
		int									numSamples;
		MultisampleRenderCase::RenderTarget	target;
	} targets[] =
	{
		{ "default_framebuffer",		"Test with default framebuffer",	0,	MultisampleRenderCase::TARGET_DEFAULT		},
		{ "singlesample_texture",		"Test with singlesample texture",	0,	MultisampleRenderCase::TARGET_TEXTURE		},
		{ "multisample_texture_1",		"Test with multisample texture",	1,	MultisampleRenderCase::TARGET_TEXTURE		},
		{ "multisample_texture_2",		"Test with multisample texture",	2,	MultisampleRenderCase::TARGET_TEXTURE		},
		{ "multisample_texture_4",		"Test with multisample texture",	4,	MultisampleRenderCase::TARGET_TEXTURE		},
		{ "multisample_texture_8",		"Test with multisample texture",	8,	MultisampleRenderCase::TARGET_TEXTURE		},
		{ "multisample_texture_16",		"Test with multisample texture",	16,	MultisampleRenderCase::TARGET_TEXTURE		},
		{ "singlesample_rbo",			"Test with singlesample rbo",		0,	MultisampleRenderCase::TARGET_RENDERBUFFER	},
		{ "multisample_rbo_1",			"Test with multisample rbo",		1,	MultisampleRenderCase::TARGET_RENDERBUFFER	},
		{ "multisample_rbo_2",			"Test with multisample rbo",		2,	MultisampleRenderCase::TARGET_RENDERBUFFER	},
		{ "multisample_rbo_4",			"Test with multisample rbo",		4,	MultisampleRenderCase::TARGET_RENDERBUFFER	},
		{ "multisample_rbo_8",			"Test with multisample rbo",		8,	MultisampleRenderCase::TARGET_RENDERBUFFER	},
		{ "multisample_rbo_16",			"Test with multisample rbo",		16,	MultisampleRenderCase::TARGET_RENDERBUFFER	},
	};

	static const struct
	{
		const char*									name;
		const char*									description;
		NegativeCompileInterpolationCase::CaseType	caseType;
	} negativeCompileCases[] =
	{
		{ "vec4_identity_swizzle",		"use identity swizzle",				NegativeCompileInterpolationCase::CASE_VEC4_IDENTITY_SWIZZLE		},
		{ "vec4_crop_swizzle",			"use cropped identity swizzle",		NegativeCompileInterpolationCase::CASE_VEC4_CROP_SWIZZLE			},
		{ "vec4_mixed_swizzle",			"use swizzle",						NegativeCompileInterpolationCase::CASE_VEC4_MIXED_SWIZZLE			},
		{ "interpolate_ivec4",			"interpolate integer variable",		NegativeCompileInterpolationCase::CASE_INTERPOLATE_IVEC4			},
		{ "interpolate_uvec4",			"interpolate integer variable",		NegativeCompileInterpolationCase::CASE_INTERPOLATE_UVEC4			},
		{ "interpolate_array",			"interpolate whole array",			NegativeCompileInterpolationCase::CASE_INTERPOLATE_ARRAY			},
		{ "interpolate_struct",			"interpolate whole struct",			NegativeCompileInterpolationCase::CASE_INTERPOLATE_STRUCT			},
		{ "interpolate_struct_member",	"interpolate struct member",		NegativeCompileInterpolationCase::CASE_INTERPOLATE_STRUCT_MEMBER	},
		{ "interpolate_local",			"interpolate local variable",		NegativeCompileInterpolationCase::CASE_INTERPOLATE_LOCAL			},
		{ "interpolate_global",			"interpolate global variable",		NegativeCompileInterpolationCase::CASE_INTERPOLATE_GLOBAL			},
		{ "interpolate_constant",		"interpolate constant variable",	NegativeCompileInterpolationCase::CASE_INTERPOLATE_CONSTANT			},
	};

	// .sample_qualifier
	{
		tcu::TestCaseGroup* const sampleQualifierGroup = new tcu::TestCaseGroup(m_testCtx, "sample_qualifier", "Test sample qualifier");
		addChild(sampleQualifierGroup);

		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
			sampleQualifierGroup->addChild(new SampleQualifierRenderCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target));
	}

	// .interpolate_at_sample
	{
		tcu::TestCaseGroup* const interpolateAtSampleGroup = new tcu::TestCaseGroup(m_testCtx, "interpolate_at_sample", "Test interpolateAtSample");
		addChild(interpolateAtSampleGroup);

		// .static_sample_number
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "static_sample_number", "Test interpolateAtSample sample number");
			interpolateAtSampleGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new InterpolateAtSampleRenderCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, InterpolateAtSampleRenderCase::INDEXING_STATIC));
		}

		// .dynamic_sample_number
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "dynamic_sample_number", "Test interpolateAtSample sample number");
			interpolateAtSampleGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new InterpolateAtSampleRenderCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, InterpolateAtSampleRenderCase::INDEXING_DYNAMIC));
		}

		// .non_multisample_buffer
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "non_multisample_buffer", "Test interpolateAtSample with non-multisample buffers");
			interpolateAtSampleGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				if (targets[targetNdx].numSamples == 0)
					group->addChild(new SingleSampleInterpolateAtSampleCase(m_context, std::string("sample_0_").append(targets[targetNdx].name).c_str(), targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, SingleSampleInterpolateAtSampleCase::SAMPLE_0));

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				if (targets[targetNdx].numSamples == 0)
					group->addChild(new SingleSampleInterpolateAtSampleCase(m_context, std::string("sample_n_").append(targets[targetNdx].name).c_str(), targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, SingleSampleInterpolateAtSampleCase::SAMPLE_N));
		}

		// .centroid_qualifier
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "centroid_qualified", "Test interpolateAtSample with centroid qualified varying");
			interpolateAtSampleGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new CentroidQualifierAtSampleCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target));
		}

		// .at_sample_id
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "at_sample_id", "Test interpolateAtSample at current sample id");
			interpolateAtSampleGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new InterpolateAtSampleIDCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target));
		}

		// .negative
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "negative", "interpolateAtSample negative tests");
			interpolateAtSampleGroup->addChild(group);

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(negativeCompileCases); ++ndx)
				group->addChild(new NegativeCompileInterpolationCase(m_context,
																	 negativeCompileCases[ndx].name,
																	 negativeCompileCases[ndx].description,
																	 negativeCompileCases[ndx].caseType,
																	 NegativeCompileInterpolationCase::INTERPOLATE_AT_SAMPLE));
		}
	}

	// .interpolate_at_centroid
	{
		tcu::TestCaseGroup* const methodGroup = new tcu::TestCaseGroup(m_testCtx, "interpolate_at_centroid", "Test interpolateAtCentroid");
		addChild(methodGroup);

		// .consistency
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "consistency", "Test interpolateAtCentroid return value is consistent to centroid qualified value");
			methodGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new InterpolateAtCentroidCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, InterpolateAtCentroidCase::TEST_CONSISTENCY));
		}

		// .array_element
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "array_element", "Test interpolateAtCentroid with array element");
			methodGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new InterpolateAtCentroidCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, InterpolateAtCentroidCase::TEST_ARRAY_ELEMENT));
		}

		// .negative
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "negative", "interpolateAtCentroid negative tests");
			methodGroup->addChild(group);

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(negativeCompileCases); ++ndx)
				group->addChild(new NegativeCompileInterpolationCase(m_context,
																	 negativeCompileCases[ndx].name,
																	 negativeCompileCases[ndx].description,
																	 negativeCompileCases[ndx].caseType,
																	 NegativeCompileInterpolationCase::INTERPOLATE_AT_CENTROID));
		}
	}

	// .interpolate_at_offset
	{
		static const struct TestConfig
		{
			const char*							name;
			InterpolateAtOffsetCase::TestType	type;
		} configs[] =
		{
			{ "no_qualifiers",		InterpolateAtOffsetCase::TEST_QUALIFIER_NONE		},
			{ "centroid_qualifier",	InterpolateAtOffsetCase::TEST_QUALIFIER_CENTROID	},
			{ "sample_qualifier",	InterpolateAtOffsetCase::TEST_QUALIFIER_SAMPLE		},
		};

		tcu::TestCaseGroup* const methodGroup = new tcu::TestCaseGroup(m_testCtx, "interpolate_at_offset", "Test interpolateAtOffset");
		addChild(methodGroup);

		// .no_qualifiers
		// .centroid_qualifier
		// .sample_qualifier
		for (int configNdx = 0; configNdx < DE_LENGTH_OF_ARRAY(configs); ++configNdx)
		{
			tcu::TestCaseGroup* const qualifierGroup = new tcu::TestCaseGroup(m_testCtx, configs[configNdx].name, "Test interpolateAtOffset with qualified/non-qualified varying");
			methodGroup->addChild(qualifierGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				qualifierGroup->addChild(new InterpolateAtOffsetCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, configs[configNdx].type));
		}

		// .at_sample_position
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "at_sample_position", "Test interpolateAtOffset at sample position");
			methodGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new InterpolateAtSamplePositionCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target));
		}

		// .array_element
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "array_element", "Test interpolateAtOffset with array element");
			methodGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new InterpolateAtOffsetCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, InterpolateAtOffsetCase::TEST_ARRAY_ELEMENT));
		}

		// .negative
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "negative", "interpolateAtOffset negative tests");
			methodGroup->addChild(group);

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(negativeCompileCases); ++ndx)
				group->addChild(new NegativeCompileInterpolationCase(m_context,
																	 negativeCompileCases[ndx].name,
																	 negativeCompileCases[ndx].description,
																	 negativeCompileCases[ndx].caseType,
																	 NegativeCompileInterpolationCase::INTERPOLATE_AT_OFFSET));
		}
	}
}